

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmComputeTargetDepends.cxx
# Opt level: O0

bool __thiscall
cmComputeTargetDepends::IntraComponent
          (cmComputeTargetDepends *this,vector<int,_std::allocator<int>_> *cmap,int c,int i,
          int *head,set<int,_std::less<int>,_std::allocator<int>_> *emitted,
          set<int,_std::less<int>,_std::allocator<int>_> *visited)

{
  int iVar1;
  bool bVar2;
  vector<cmGraphEdge,_std::allocator<cmGraphEdge>_> *this_00;
  const_reference pvVar3;
  cmListFileBacktrace *__args_2;
  vector<cmGraphEdge,std::allocator<cmGraphEdge>> *pvVar4;
  reference pvVar5;
  pair<std::_Rb_tree_const_iterator<int>,_bool> pVar6;
  cmListFileBacktrace local_b8;
  bool local_a6;
  bool local_a5;
  int local_a4;
  reference pcStack_a0;
  int j;
  cmGraphEdge *edge;
  const_iterator __end2;
  const_iterator __begin2;
  EdgeList *__range2;
  EdgeList *el;
  set<int,_std::less<int>,_std::allocator<int>_> *emitted_local;
  int *head_local;
  int i_local;
  int c_local;
  vector<int,_std::allocator<int>_> *cmap_local;
  cmComputeTargetDepends *this_local;
  
  head_local._0_4_ = i;
  head_local._4_4_ = c;
  _i_local = cmap;
  cmap_local = (vector<int,_std::allocator<int>_> *)this;
  pVar6 = std::set<int,_std::less<int>,_std::allocator<int>_>::insert
                    (visited,(value_type_conflict2 *)&head_local);
  if (((pVar6.second ^ 0xffU) & 1) == 0) {
    pVar6 = std::set<int,_std::less<int>,_std::allocator<int>_>::insert
                      (emitted,(value_type_conflict2 *)&head_local);
    if (((undefined1  [16])pVar6 & (undefined1  [16])0x1) != (undefined1  [16])0x0) {
      this_00 = &std::vector<cmGraphEdgeList,_std::allocator<cmGraphEdgeList>_>::operator[]
                           (&(this->InitialGraph).
                             super_vector<cmGraphEdgeList,_std::allocator<cmGraphEdgeList>_>,
                            (long)(int)head_local)->
                 super_vector<cmGraphEdge,_std::allocator<cmGraphEdge>_>;
      __end2 = std::vector<cmGraphEdge,_std::allocator<cmGraphEdge>_>::begin(this_00);
      edge = (cmGraphEdge *)std::vector<cmGraphEdge,_std::allocator<cmGraphEdge>_>::end(this_00);
      while (bVar2 = __gnu_cxx::operator!=
                               (&__end2,(__normal_iterator<const_cmGraphEdge_*,_std::vector<cmGraphEdge,_std::allocator<cmGraphEdge>_>_>
                                         *)&edge), iVar1 = (int)head_local, bVar2) {
        pcStack_a0 = __gnu_cxx::
                     __normal_iterator<const_cmGraphEdge_*,_std::vector<cmGraphEdge,_std::allocator<cmGraphEdge>_>_>
                     ::operator*(&__end2);
        local_a4 = cmGraphEdge::operator_cast_to_int(pcStack_a0);
        pvVar3 = std::vector<int,_std::allocator<int>_>::operator[](_i_local,(long)local_a4);
        if ((*pvVar3 == head_local._4_4_) && (bVar2 = cmGraphEdge::IsStrong(pcStack_a0), bVar2)) {
          pvVar4 = (vector<cmGraphEdge,std::allocator<cmGraphEdge>> *)
                   std::vector<cmGraphEdgeList,_std::allocator<cmGraphEdgeList>_>::operator[]
                             (&(this->FinalGraph).
                               super_vector<cmGraphEdgeList,_std::allocator<cmGraphEdgeList>_>,
                              (long)(int)head_local);
          local_a5 = true;
          __args_2 = cmGraphEdge::GetBacktrace(pcStack_a0);
          std::vector<cmGraphEdge,std::allocator<cmGraphEdge>>::
          emplace_back<int&,bool,cmListFileBacktrace_const&>(pvVar4,&local_a4,&local_a5,__args_2);
          bVar2 = IntraComponent(this,_i_local,head_local._4_4_,local_a4,head,emitted,visited);
          if (!bVar2) {
            return false;
          }
        }
        __gnu_cxx::
        __normal_iterator<const_cmGraphEdge_*,_std::vector<cmGraphEdge,_std::allocator<cmGraphEdge>_>_>
        ::operator++(&__end2);
      }
      if (*head < 0) {
        pvVar5 = std::vector<int,_std::allocator<int>_>::operator[]
                           (&this->ComponentTail,(long)head_local._4_4_);
        *pvVar5 = iVar1;
      }
      else {
        pvVar4 = (vector<cmGraphEdge,std::allocator<cmGraphEdge>> *)
                 std::vector<cmGraphEdgeList,_std::allocator<cmGraphEdgeList>_>::operator[]
                           (&(this->FinalGraph).
                             super_vector<cmGraphEdgeList,_std::allocator<cmGraphEdgeList>_>,
                            (long)(int)head_local);
        local_a6 = false;
        local_b8.TopEntry.
        super___shared_ptr<const_cmListFileBacktrace::Entry,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
             (element_type *)0x0;
        local_b8.TopEntry.
        super___shared_ptr<const_cmListFileBacktrace::Entry,_(__gnu_cxx::_Lock_policy)2>._M_refcount
        ._M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
        cmListFileBacktrace::cmListFileBacktrace(&local_b8);
        std::vector<cmGraphEdge,std::allocator<cmGraphEdge>>::
        emplace_back<int&,bool,cmListFileBacktrace>(pvVar4,head,&local_a6,&local_b8);
        cmListFileBacktrace::~cmListFileBacktrace(&local_b8);
      }
      *head = (int)head_local;
    }
    this_local._7_1_ = true;
  }
  else {
    this_local._7_1_ = false;
  }
  return this_local._7_1_;
}

Assistant:

bool cmComputeTargetDepends::IntraComponent(std::vector<int> const& cmap,
                                            int c, int i, int* head,
                                            std::set<int>& emitted,
                                            std::set<int>& visited)
{
  if (!visited.insert(i).second) {
    // Cycle in utility depends!
    return false;
  }
  if (emitted.insert(i).second) {
    // Honor strong intra-component edges in the final order.
    EdgeList const& el = this->InitialGraph[i];
    for (cmGraphEdge const& edge : el) {
      int j = edge;
      if (cmap[j] == c && edge.IsStrong()) {
        this->FinalGraph[i].emplace_back(j, true, edge.GetBacktrace());
        if (!this->IntraComponent(cmap, c, j, head, emitted, visited)) {
          return false;
        }
      }
    }

    // Prepend to a linear linked-list of intra-component edges.
    if (*head >= 0) {
      this->FinalGraph[i].emplace_back(*head, false, cmListFileBacktrace());
    } else {
      this->ComponentTail[c] = i;
    }
    *head = i;
  }
  return true;
}